

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::Detail::Approx::toString_abi_cxx11_(string *__return_storage_ptr__,Approx *this)

{
  ReusableStringStream rss;
  ReusableStringStream local_50;
  string local_38;
  
  ReusableStringStream::ReusableStringStream(&local_50);
  std::operator<<(local_50.m_oss,"Approx( ");
  stringify<double>(&local_38,&this->m_value);
  std::operator<<(local_50.m_oss,(string *)&local_38);
  std::operator<<(local_50.m_oss," )");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::stringbuf::str();
  ReusableStringStream::~ReusableStringStream(&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string Approx::toString() const {
        ReusableStringStream rss;
        rss << "Approx( " << ::Catch::Detail::stringify( m_value ) << " )";
        return rss.str();
    }